

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

Header * SQLite::Database::getHeaderInfo(Header *__return_storage_ptr__,string *aFilename)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Exception *pEVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long in_FS_OFFSET;
  ifstream fileBuffer;
  uchar buf [100];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ushort local_88;
  uchar local_86;
  uchar local_85;
  uchar local_84;
  uchar local_83;
  uchar local_82;
  uchar local_81;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_3c;
  undefined4 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (aFilename->_M_string_length == 0) {
    pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar3,"Filename parameter is empty");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::ifstream::ifstream(local_2a0,(aFilename->_M_dataplus)._M_p,_S_in|_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
      std::operator+(&local_2c0,"Error opening file ",aFilename);
      Exception::Exception(pEVar3,local_2c0._M_dataplus._M_p,-1);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::istream::seekg((long)local_2a0,_S_beg);
      std::istream::read((char *)local_2a0,(long)&local_98);
      std::ifstream::close();
      if ((long)local_2a0[0]._M_string_length < 100) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
        std::operator+(&local_2e0,"File ",aFilename);
        pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_2e0," is too short");
        local_2c0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
        paVar4 = &pbVar2->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p == paVar4) {
          local_2c0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
          local_2c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        }
        local_2c0._M_string_length = pbVar2->_M_string_length;
        (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar2->_M_string_length = 0;
        (pbVar2->field_2)._M_local_buf[0] = '\0';
        Exception::Exception(pEVar3,local_2c0._M_dataplus._M_p,-1);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        std::ifstream::~ifstream(local_2a0);
        *(undefined4 *)__return_storage_ptr__->headerStr = local_98;
        *(undefined4 *)(__return_storage_ptr__->headerStr + 4) = uStack_94;
        *(undefined4 *)(__return_storage_ptr__->headerStr + 8) = uStack_90;
        *(undefined4 *)(__return_storage_ptr__->headerStr + 0xc) = uStack_8c;
        __return_storage_ptr__->headerStr[0xf] = '\0';
        if (*(long *)(__return_storage_ptr__->headerStr + 7) == 0x332074616d726f66 &&
            *(long *)__return_storage_ptr__->headerStr == 0x66206574694c5153) {
          __return_storage_ptr__->pageSizeBytes = (uint)(ushort)(local_88 << 8 | local_88 >> 8);
          __return_storage_ptr__->fileFormatWriteVersion = local_86;
          __return_storage_ptr__->fileFormatReadVersion = local_85;
          __return_storage_ptr__->reservedSpaceBytes = local_84;
          __return_storage_ptr__->maxEmbeddedPayloadFrac = local_83;
          __return_storage_ptr__->minEmbeddedPayloadFrac = local_82;
          __return_storage_ptr__->leafPayloadFrac = local_81;
          __return_storage_ptr__->fileChangeCounter =
               (ulong)local_80._3_1_ |
               (ulong)local_80._2_1_ << 8 | (long)(local_80 << 0x18) | (ulong)local_80._1_1_ << 0x10
          ;
          __return_storage_ptr__->databaseSizePages =
               (ulong)local_7c._3_1_ |
               (ulong)local_7c._2_1_ << 8 | (long)(local_7c << 0x18) | (ulong)local_7c._1_1_ << 0x10
          ;
          __return_storage_ptr__->firstFreelistTrunkPage =
               (ulong)local_78._3_1_ |
               (ulong)local_78._2_1_ << 8 | (long)(local_78 << 0x18) | (ulong)local_78._1_1_ << 0x10
          ;
          __return_storage_ptr__->totalFreelistPages =
               (ulong)local_74._3_1_ |
               (ulong)local_74._2_1_ << 8 | (long)(local_74 << 0x18) | (ulong)local_74._1_1_ << 0x10
          ;
          __return_storage_ptr__->schemaCookie =
               (ulong)local_70._3_1_ |
               (ulong)local_70._2_1_ << 8 | (long)(local_70 << 0x18) | (ulong)local_70._1_1_ << 0x10
          ;
          __return_storage_ptr__->schemaFormatNumber =
               (ulong)local_6c._3_1_ |
               (ulong)local_6c._2_1_ << 8 | (long)(local_6c << 0x18) | (ulong)local_6c._1_1_ << 0x10
          ;
          __return_storage_ptr__->defaultPageCacheSizeBytes =
               (ulong)local_68._3_1_ |
               (ulong)local_68._2_1_ << 8 | (long)(local_68 << 0x18) | (ulong)local_68._1_1_ << 0x10
          ;
          __return_storage_ptr__->largestBTreePageNumber =
               (ulong)local_64._3_1_ |
               (ulong)local_64._2_1_ << 8 | (long)(local_64 << 0x18) | (ulong)local_64._1_1_ << 0x10
          ;
          __return_storage_ptr__->databaseTextEncoding =
               (ulong)local_60._3_1_ |
               (ulong)local_60._2_1_ << 8 | (long)(local_60 << 0x18) | (ulong)local_60._1_1_ << 0x10
          ;
          __return_storage_ptr__->userVersion =
               (ulong)local_5c._3_1_ |
               (ulong)local_5c._2_1_ << 8 | (long)(local_5c << 0x18) | (ulong)local_5c._1_1_ << 0x10
          ;
          __return_storage_ptr__->incrementalVaccumMode =
               (ulong)local_58._3_1_ |
               (ulong)local_58._2_1_ << 8 | (long)(local_58 << 0x18) | (ulong)local_58._1_1_ << 0x10
          ;
          __return_storage_ptr__->applicationId =
               (ulong)local_54._3_1_ |
               (ulong)local_54._2_1_ << 8 | (long)(local_54 << 0x18) | (ulong)local_54._1_1_ << 0x10
          ;
          __return_storage_ptr__->versionValidFor =
               (ulong)local_3c._3_1_ |
               (ulong)local_3c._2_1_ << 8 | (long)(local_3c << 0x18) | (ulong)local_3c._1_1_ << 0x10
          ;
          __return_storage_ptr__->sqliteVersion =
               (ulong)local_38._3_1_ |
               (ulong)local_38._2_1_ << 8 | (long)(local_38 << 0x18) | (ulong)local_38._1_1_ << 0x10
          ;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            return __return_storage_ptr__;
          }
        }
        else {
          pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
          std::operator+(local_2a0,"Invalid or encrypted SQLite header in file ",aFilename);
          Exception::Exception(pEVar3,local_2a0[0]._M_dataplus._M_p,-1);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Header Database::getHeaderInfo(const std::string& aFilename)
{
    Header h;
    unsigned char buf[100];
    char* pBuf = reinterpret_cast<char*>(&buf[0]);
    char* pHeaderStr = reinterpret_cast<char*>(&h.headerStr[0]);

    if (aFilename.empty())
    {
        throw SQLite::Exception("Filename parameter is empty");
    }

    {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        if (fileBuffer.is_open())
        {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.read(pBuf, 100);
            fileBuffer.close();
            if (fileBuffer.gcount() < 100)
            {
                throw SQLite::Exception("File " + aFilename + " is too short");
            }
        }
        else
        {
            throw SQLite::Exception("Error opening file " + aFilename);
        }
    }

    // If the "magic string" can't be found then header is invalid, corrupt or unreadable
    memcpy(pHeaderStr, pBuf, 16);
    pHeaderStr[15] = '\0';
    if (strncmp(pHeaderStr, "SQLite format 3", 15) != 0)
    {
        throw SQLite::Exception("Invalid or encrypted SQLite header in file " + aFilename);
    }

    h.pageSizeBytes = (buf[16] << 8) | buf[17];
    h.fileFormatWriteVersion = buf[18];
    h.fileFormatReadVersion = buf[19];
    h.reservedSpaceBytes = buf[20];
    h.maxEmbeddedPayloadFrac = buf[21];
    h.minEmbeddedPayloadFrac = buf[22];
    h.leafPayloadFrac = buf[23];

    h.fileChangeCounter =
        (buf[24] << 24) |
        (buf[25] << 16) |
        (buf[26] << 8)  |
        (buf[27] << 0);

    h.databaseSizePages =
        (buf[28] << 24) |
        (buf[29] << 16) |
        (buf[30] << 8)  |
        (buf[31] << 0);

    h.firstFreelistTrunkPage =
        (buf[32] << 24) |
        (buf[33] << 16) |
        (buf[34] << 8)  |
        (buf[35] << 0);

    h.totalFreelistPages =
        (buf[36] << 24) |
        (buf[37] << 16) |
        (buf[38] << 8)  |
        (buf[39] << 0);

    h.schemaCookie =
        (buf[40] << 24) |
        (buf[41] << 16) |
        (buf[42] << 8)  |
        (buf[43] << 0);

    h.schemaFormatNumber =
        (buf[44] << 24) |
        (buf[45] << 16) |
        (buf[46] << 8)  |
        (buf[47] << 0);

    h.defaultPageCacheSizeBytes =
        (buf[48] << 24) |
        (buf[49] << 16) |
        (buf[50] << 8)  |
        (buf[51] << 0);

    h.largestBTreePageNumber =
        (buf[52] << 24) |
        (buf[53] << 16) |
        (buf[54] << 8)  |
        (buf[55] << 0);

    h.databaseTextEncoding =
        (buf[56] << 24) |
        (buf[57] << 16) |
        (buf[58] << 8)  |
        (buf[59] << 0);

    h.userVersion =
        (buf[60] << 24) |
        (buf[61] << 16) |
        (buf[62] << 8)  |
        (buf[63] << 0);

    h.incrementalVaccumMode =
        (buf[64] << 24) |
        (buf[65] << 16) |
        (buf[66] << 8)  |
        (buf[67] << 0);

    h.applicationId =
        (buf[68] << 24) |
        (buf[69] << 16) |
        (buf[70] << 8)  |
        (buf[71] << 0);

    h.versionValidFor =
        (buf[92] << 24) |
        (buf[93] << 16) |
        (buf[94] << 8)  |
        (buf[95] << 0);

    h.sqliteVersion =
        (buf[96] << 24) |
        (buf[97] << 16) |
        (buf[98] << 8)  |
        (buf[99] << 0);

    return h;
}